

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManBuildFromMiniInt(Gia_Man_t *pNew,Vec_Int_t *vLeaves,Vec_Int_t *vAig,int fHash)

{
  int iVar2;
  int iVar3;
  uint uVar4;
  int Lit;
  int i_00;
  int i_01;
  int local_60;
  int local_58;
  int local_48;
  int iLit;
  int iLit1;
  int iLit0;
  int iVar1;
  int iVar0;
  int i;
  int nLeaves;
  int fHash_local;
  Vec_Int_t *vAig_local;
  Vec_Int_t *vLeaves_local;
  Gia_Man_t *pNew_local;
  
  iVar2 = Vec_IntSize(vAig);
  if (iVar2 < 1) {
    __assert_fail("Vec_IntSize(vAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x353,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  iVar2 = Vec_IntEntryLast(vAig);
  if (1 < iVar2) {
    __assert_fail("Vec_IntEntryLast(vAig) < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x354,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  iVar2 = Vec_IntSize(vAig);
  if (iVar2 == 1) {
    pNew_local._4_4_ = Vec_IntEntry(vAig,0);
  }
  else {
    iVar2 = Vec_IntSize(vAig);
    if (iVar2 == 2) {
      iVar2 = Vec_IntEntry(vAig,0);
      if (iVar2 != 0) {
        __assert_fail("Vec_IntEntry(vAig, 0) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x359,
                      "int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
      }
      iVar2 = Vec_IntSize(vLeaves);
      if (iVar2 != 1) {
        __assert_fail("Vec_IntSize(vLeaves) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x35a,
                      "int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
      }
      iVar2 = Vec_IntEntry(vLeaves,0);
      iVar3 = Vec_IntEntry(vAig,1);
      pNew_local._4_4_ = Abc_LitNotCond(iVar2,iVar3);
    }
    else {
      iVar2 = Vec_IntSize(vLeaves);
      local_48 = 0;
      uVar4 = Vec_IntSize(vAig);
      if ((uVar4 & 1) == 0) {
        __assert_fail("Vec_IntSize(vAig) & 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x361,
                      "int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
      }
      for (iVar1 = 0; iVar3 = Vec_IntSize(vAig), iVar1 + 1 < iVar3; iVar1 = iVar1 + 2) {
        iVar3 = Vec_IntEntry(vAig,iVar1);
        Lit = Vec_IntEntry(vAig,iVar1 + 1);
        i_00 = Abc_Lit2Var(iVar3);
        i_01 = Abc_Lit2Var(Lit);
        if (i_00 < iVar2) {
          local_58 = Vec_IntEntry(vLeaves,i_00);
        }
        else {
          local_58 = Vec_IntEntry(vAig,i_00 - iVar2);
        }
        iVar3 = Abc_LitIsCompl(iVar3);
        local_48 = Abc_LitNotCond(local_58,iVar3);
        if (i_01 < iVar2) {
          local_60 = Vec_IntEntry(vLeaves,i_01);
        }
        else {
          local_60 = Vec_IntEntry(vAig,i_01 - iVar2);
        }
        iVar3 = Abc_LitIsCompl(Lit);
        iVar3 = Abc_LitNotCond(local_60,iVar3);
        if (fHash == 0) {
          if (local_48 != iVar3) {
            local_48 = Gia_ManAppendAnd(pNew,local_48,iVar3);
          }
        }
        else {
          local_48 = Gia_ManHashAnd(pNew,local_48,iVar3);
        }
        iVar3 = Abc_Lit2Var(iVar1);
        Vec_IntWriteEntry(vAig,iVar3,local_48);
      }
      iVar2 = Vec_IntSize(vAig);
      if (iVar1 != iVar2 + -1) {
        __assert_fail("i == Vec_IntSize(vAig) - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x371,
                      "int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
      }
      iVar2 = Vec_IntEntry(vAig,iVar1);
      pNew_local._4_4_ = Abc_LitNotCond(local_48,iVar2);
      Vec_IntClear(vAig);
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Gia_ManBuildFromMiniInt( Gia_Man_t * pNew, Vec_Int_t * vLeaves, Vec_Int_t * vAig, int fHash )
{
    assert( Vec_IntSize(vAig) > 0 );
    assert( Vec_IntEntryLast(vAig) < 2 );
    if ( Vec_IntSize(vAig) == 1 ) // const
        return Vec_IntEntry(vAig, 0);
    if ( Vec_IntSize(vAig) == 2 ) // variable
    {
        assert( Vec_IntEntry(vAig, 0) == 0 );
        assert( Vec_IntSize(vLeaves) == 1 );
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, 0), Vec_IntEntry(vAig, 1) );
    }
    else
    {
        int nLeaves = Vec_IntSize(vLeaves);
        int i, iVar0, iVar1, iLit0, iLit1, iLit = 0;
        assert( Vec_IntSize(vAig) & 1 );
        Vec_IntForEachEntryDouble( vAig, iLit0, iLit1, i )
        {
            iVar0 = Abc_Lit2Var( iLit0 );
            iVar1 = Abc_Lit2Var( iLit1 );
            iLit0 = Abc_LitNotCond( iVar0 < nLeaves ? Vec_IntEntry(vLeaves, iVar0) : Vec_IntEntry(vAig, iVar0 - nLeaves), Abc_LitIsCompl(iLit0) );
            iLit1 = Abc_LitNotCond( iVar1 < nLeaves ? Vec_IntEntry(vLeaves, iVar1) : Vec_IntEntry(vAig, iVar1 - nLeaves), Abc_LitIsCompl(iLit1) );
            if ( fHash )
                iLit = Gia_ManHashAnd( pNew, iLit0, iLit1 );
            else if ( iLit0 == iLit1 )
                iLit = iLit0;
            else
                iLit = Gia_ManAppendAnd( pNew, iLit0, iLit1 );
            assert( (i & 1) == 0 );
            Vec_IntWriteEntry( vAig, Abc_Lit2Var(i), iLit );  // overwriting entries
        }
        assert( i == Vec_IntSize(vAig) - 1 );
        iLit = Abc_LitNotCond( iLit, Vec_IntEntry(vAig, i) );
        Vec_IntClear( vAig ); // useless
        return iLit;
    }
}